

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniformScalingShape.cpp
# Opt level: O2

void __thiscall
btUniformScalingShape::getAabbSlow
          (btUniformScalingShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  btVector3 *x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  btVector3 bVar4;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  btScalar local_128 [4];
  float local_118;
  float local_108;
  undefined1 local_f8 [20];
  undefined4 local_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c4;
  undefined8 uStack_bc;
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  btVector3 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_f8._0_4_ = 0x3f800000;
  local_f8._4_8_ = 0;
  local_f8._12_8_ = 0;
  local_e4 = 0x3f800000;
  local_e0 = 0;
  uStack_d8 = 0;
  local_d0 = 0x3f800000;
  local_c8 = 0xbf800000;
  local_c4 = 0;
  uStack_bc = 0;
  local_b4 = 0xbf800000;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0xbf800000;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98.m_floats[0] = 0.0;
  local_98.m_floats[1] = 0.0;
  local_98.m_floats[2] = 0.0;
  local_98.m_floats[3] = 0.0;
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x10) {
    bVar4 = operator*((btVector3 *)(local_f8 + lVar3),&t->m_basis);
    *&((btVector3 *)(local_f8 + lVar3))->m_floats = bVar4.m_floats;
  }
  x = &local_98;
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0x13])
            (this,local_f8,x,6);
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    bVar4 = btTransform::operator()(t,x);
    local_128[0] = bVar4.m_floats[0];
    local_128[1] = bVar4.m_floats[1];
    local_128[2] = bVar4.m_floats[2];
    local_128[3] = bVar4.m_floats[3];
    *(undefined4 *)((long)&local_148 + lVar3) = *(undefined4 *)((long)local_128 + lVar3);
    bVar4 = btTransform::operator()(t,x + 3);
    local_128[0] = bVar4.m_floats[0];
    local_128[1] = bVar4.m_floats[1];
    local_128[2] = bVar4.m_floats[2];
    local_128[3] = bVar4.m_floats[3];
    *(undefined4 *)((long)&local_138 + lVar3) = *(undefined4 *)((long)local_128 + lVar3);
    x = x + 1;
  }
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  local_108 = extraout_XMM0_Da;
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  local_118 = extraout_XMM0_Da_00;
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  auVar1._4_4_ = (float)((ulong)local_138 >> 0x20) - local_118;
  auVar1._0_4_ = (float)local_138 - local_108;
  auVar1._8_4_ = (float)uStack_130 - extraout_XMM0_Da_01;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar1;
  auVar2._4_4_ = (float)((ulong)local_148 >> 0x20) + local_118;
  auVar2._0_4_ = (float)local_148 + local_108;
  auVar2._8_4_ = extraout_XMM0_Da_01 + (float)uStack_140;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar2;
  return;
}

Assistant:

void btUniformScalingShape::getAabbSlow(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
#if 1
	btVector3 _directions[] =
	{
		btVector3( 1.,  0.,  0.),
		btVector3( 0.,  1.,  0.),
		btVector3( 0.,  0.,  1.),
		btVector3( -1., 0.,  0.),
		btVector3( 0., -1.,  0.),
		btVector3( 0.,  0., -1.)
	};
	
	btVector3 _supporting[] =
	{
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.),
		btVector3( 0., 0., 0.)
	};

	for (int i=0;i<6;i++)
	{
		_directions[i] = _directions[i]*t.getBasis();
	}
	
	batchedUnitVectorGetSupportingVertexWithoutMargin(_directions, _supporting, 6);
	
	btVector3 aabbMin1(0,0,0),aabbMax1(0,0,0);

	for ( int i = 0; i < 3; ++i )
	{
		aabbMax1[i] = t(_supporting[i])[i];
		aabbMin1[i] = t(_supporting[i + 3])[i];
	}
	btVector3 marginVec(getMargin(),getMargin(),getMargin());
	aabbMin = aabbMin1-marginVec;
	aabbMax = aabbMax1+marginVec;
	
#else

	btScalar margin = getMargin();
	for (int i=0;i<3;i++)
	{
		btVector3 vec(btScalar(0.),btScalar(0.),btScalar(0.));
		vec[i] = btScalar(1.);
		btVector3 sv = localGetSupportingVertex(vec*t.getBasis());
		btVector3 tmp = t(sv);
		aabbMax[i] = tmp[i]+margin;
		vec[i] = btScalar(-1.);
		sv = localGetSupportingVertex(vec*t.getBasis());
		tmp = t(sv);
		aabbMin[i] = tmp[i]-margin;
	}

#endif
}